

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall
pbrt::Image::SelectChannels
          (Image *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,Allocator alloc)

{
  int iVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  descChannelNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long local_70;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_68;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_60;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((desc->offset).nStored != 0) {
    uVar4 = 0;
    do {
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                *)(desc->offset).ptr;
      if (paVar2 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)0x0) {
        paVar2 = &(desc->offset).field_2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_88,(this->channelNames).ptr + paVar2->fixed[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (desc->offset).nStored);
  }
  local_68.bits =
       (this->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = (long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
  channels.ptr = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  Image(__return_storage_ptr__,this->format,
        (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,channels,
        (ColorEncodingHandle *)&local_68,alloc);
  iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  if (0 < iVar1) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
        lVar6 = 0;
        local_70 = lVar5;
        do {
          GetChannels((ImageChannelValues *)&local_60,this,(Point2i)(lVar3 + lVar6),desc,
                      (WrapMode2D)0x200000002);
          SetChannels(__return_storage_ptr__,(Point2i)(lVar3 + lVar6),
                      (ImageChannelValues *)&local_60);
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    (&local_60);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
        iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
        lVar5 = local_70;
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x100000000;
    } while (lVar5 < iVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Image Image::SelectChannels(const ImageChannelDesc &desc, Allocator alloc) const {
    std::vector<std::string> descChannelNames;
    // TODO: descChannelNames = ChannelNames(desc)
    for (size_t i = 0; i < desc.offset.size(); ++i)
        descChannelNames.push_back(channelNames[desc.offset[i]]);

    Image image(format, resolution, descChannelNames, encoding, alloc);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            image.SetChannels({x, y}, GetChannels({x, y}, desc));
    return image;
}